

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
cmNinjaTargetGenerator::New(cmGeneratorTarget *target)

{
  TargetType TVar1;
  cmGeneratorTarget *in_RSI;
  tuple<cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_> in_RDI;
  cmGeneratorTarget *local_18;
  
  TVar1 = cmGeneratorTarget::GetType(in_RSI);
  if (TVar1 < UTILITY) {
    std::make_unique<cmNinjaNormalTargetGenerator,cmGeneratorTarget*&>(&local_18);
  }
  else {
    if (2 < TVar1 - UTILITY) {
      *(undefined8 *)
       in_RDI.
       super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
       .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>._M_head_impl = 0;
      return (__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
              )(tuple<cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>)
               in_RDI.
               super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
               .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>._M_head_impl;
    }
    std::make_unique<cmNinjaUtilityTargetGenerator,cmGeneratorTarget*&>(&local_18);
  }
  *(cmGeneratorTarget **)
   in_RDI.
   super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>.
   super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>._M_head_impl = local_18;
  return (__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
          )(tuple<cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>)
           in_RDI.
           super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
           .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<cmNinjaTargetGenerator> cmNinjaTargetGenerator::New(
  cmGeneratorTarget* target)
{
  switch (target->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::OBJECT_LIBRARY:
      return cm::make_unique<cmNinjaNormalTargetGenerator>(target);

    case cmStateEnums::UTILITY:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::GLOBAL_TARGET:
      return cm::make_unique<cmNinjaUtilityTargetGenerator>(target);

    default:
      return std::unique_ptr<cmNinjaTargetGenerator>();
  }
}